

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

bool __thiscall
LLVMBC::ModuleParseContext::parse_metadata_attachment_record
          (ModuleParseContext *this,BlockOrRecord *entry)

{
  uint64_t *puVar1;
  pointer puVar2;
  MetadataKind MVar3;
  Instruction *this_00;
  char *__s;
  MDNode *node;
  size_t sVar4;
  long lVar5;
  LoggingCallback p_Var6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  char buffer [4096];
  String local_1038 [128];
  
  bVar11 = true;
  if (entry->id == 0xb) {
    puVar1 = (entry->ops).
             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(entry->ops).
                  super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    if (lVar8 != 0) {
      this_00 = get_instruction(this,*puVar1);
      if (this_00 != (Instruction *)0x0) {
        uVar9 = (lVar8 >> 3) - 1;
        bVar11 = uVar9 < 2;
        if (bVar11) {
          return bVar11;
        }
        uVar9 = uVar9 >> 1;
        uVar10 = 1;
        lVar8 = 0x10;
        while( true ) {
          puVar2 = (entry->ops).
                   super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __s = get_metadata_kind(this,*(uint64_t *)((long)puVar2 + lVar8 + -8));
          node = (MDNode *)get_metadata(this,*(uint64_t *)((long)puVar2 + lVar8));
          if (node == (MDNode *)0x0) {
            node = (MDNode *)0x0;
          }
          else {
            MVar3 = MDOperand::get_metadata_kind((MDOperand *)node);
            if (MVar3 != Node) {
              node = (MDNode *)0x0;
            }
          }
          if (__s == (char *)0x0) break;
          if (node == (MDNode *)0x0) {
            p_Var6 = ::dxil_spv::get_thread_log_callback();
            if (p_Var6 == (LoggingCallback)0x0) {
              parse_metadata_attachment_record();
              return bVar11;
            }
            local_1038[0].field_2._M_allocated_capacity._0_6_ = 0x636174746120;
            local_1038[0].field_2._M_allocated_capacity._6_2_ = 0x6d68;
            local_1038[0].field_2._8_6_ = 0xa2e746e65;
            goto LAB_00186086;
          }
          local_1038[0]._M_dataplus._M_p = (pointer)&local_1038[0].field_2;
          sVar4 = strlen(__s);
          std::__cxx11::
          basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                      *)local_1038,__s,__s + sVar4);
          Instruction::setMetadata(this_00,local_1038,node);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
            ::dxil_spv::free_in_thread(local_1038[0]._M_dataplus._M_p);
          }
          bVar11 = uVar9 <= uVar10;
          lVar5 = (-(ulong)(uVar9 == 0) - uVar9) + uVar10;
          uVar10 = uVar10 + 1;
          lVar8 = lVar8 + 0x10;
          if (lVar5 == 0) {
            return bVar11;
          }
        }
        p_Var6 = ::dxil_spv::get_thread_log_callback();
        if (p_Var6 == (LoggingCallback)0x0) {
          parse_metadata_attachment_record();
          return bVar11;
        }
        local_1038[0].field_2._M_allocated_capacity._0_6_ = 0x2e646e696b20;
        local_1038[0].field_2._M_allocated_capacity._6_2_ = 10;
LAB_00186086:
        local_1038[0]._M_string_length._6_2_ = 0x6174;
        local_1038[0]._M_string_length._0_6_ = 0x61646174656d;
        local_1038[0]._M_dataplus._M_p = (pointer)0x2064696c61766e49;
        pvVar7 = ::dxil_spv::get_thread_log_callback_userdata();
        (*p_Var6)(pvVar7,Error,(char *)local_1038);
        return bVar11;
      }
      p_Var6 = ::dxil_spv::get_thread_log_callback();
      if (p_Var6 == (LoggingCallback)0x0) {
        parse_metadata_attachment_record();
      }
      else {
        local_1038[0]._M_dataplus._M_p = (pointer)0x2064696c61766e49;
        local_1038[0]._M_string_length._0_6_ = 0x757274736e69;
        local_1038[0]._M_string_length._6_2_ = 0x7463;
        local_1038[0].field_2._M_allocated_capacity._0_6_ = 0xa2e6e6f69;
        pvVar7 = ::dxil_spv::get_thread_log_callback_userdata();
        (*p_Var6)(pvVar7,Error,(char *)local_1038);
      }
    }
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool ModuleParseContext::parse_metadata_attachment_record(const BlockOrRecord &entry)
{
	if (MetaDataRecord(entry.id) != MetaDataRecord::ATTACHMENT)
		return true;

	if (entry.ops.size() < 1)
		return false;

	size_t size = entry.ops.size();
	size_t num_nodes = (size - 1) / 2;
	auto *inst = get_instruction(entry.ops[0]);

	if (!inst)
	{
		LOGE("Invalid instruction.\n");
		return false;
	}

	for (size_t i = 0; i < num_nodes; i++)
	{
		auto *kind = get_metadata_kind(entry.ops[2 * i + 1]);
		auto *operand = get_metadata(entry.ops[2 * i + 2]);
		auto *node = dyn_cast<MDNode>(operand);

		if (!kind)
		{
			LOGE("Invalid metadata kind.\n");
			return false;
		}

		if (!node)
		{
			LOGE("Invalid metadata attachment.\n");
			return false;
		}

		inst->setMetadata(kind, node);
	}
	return true;
}